

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O1

void AES_encrypt(uchar *in,uchar *out,AES_KEY *key)

{
  char cVar1;
  short sVar9;
  short sVar10;
  short sVar11;
  ushort uVar12;
  ushort uVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [16];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined1 auVar24 [12];
  unkbyte10 Var25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int c;
  int iVar30;
  uchar *in_RCX;
  int iVar31;
  uchar *puVar32;
  int b;
  long lVar33;
  long in_FS_OFFSET;
  short sVar34;
  undefined4 uVar50;
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ulong uVar53;
  AES_state s;
  AES_state local_48;
  long local_30;
  char cVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  byte bVar6;
  char cVar7;
  char cVar8;
  undefined6 uVar35;
  undefined1 auVar36 [14];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar38 [16];
  undefined1 auVar46 [16];
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.slice[0] = 0;
  local_48.slice[1] = 0;
  local_48.slice[2] = 0;
  local_48.slice[3] = 0;
  local_48.slice[4] = 0;
  local_48.slice[5] = 0;
  local_48.slice[6] = 0;
  local_48.slice[7] = 0;
  LoadBytes(&local_48,in_RCX);
  local_48.slice._0_8_ = *(ulong *)in ^ local_48.slice._0_8_;
  local_48.slice._8_8_ = *(ulong *)(in + 8) ^ local_48.slice._8_8_;
  if (1 < (int)out) {
    iVar31 = (int)out + -1;
    puVar32 = in;
    do {
      in = puVar32 + 0x10;
      SubBytes(&local_48,0);
      ShiftRows(&local_48);
      MixColumns(&local_48,0);
      local_48.slice._0_8_ = *(ulong *)(puVar32 + 0x10) ^ local_48.slice._0_8_;
      local_48.slice._8_8_ = *(ulong *)(puVar32 + 0x18) ^ local_48.slice._8_8_;
      iVar31 = iVar31 + -1;
      puVar32 = in;
    } while (iVar31 != 0);
  }
  lVar33 = 0;
  SubBytes(&local_48,0);
  ShiftRows(&local_48);
  auVar29 = _DAT_008bfa80;
  auVar28 = _DAT_008bfa70;
  auVar27 = _DAT_008bfa60;
  auVar26 = _DAT_008bfa50;
  do {
    local_48.slice[lVar33] = local_48.slice[lVar33] ^ *(ushort *)(in + lVar33 * 2 + 0x10);
    lVar33 = lVar33 + 1;
  } while (lVar33 != 8);
  iVar31 = 0;
  do {
    iVar30 = 0;
    do {
      auVar21._8_2_ = local_48.slice[4];
      auVar21._10_2_ = local_48.slice[5];
      auVar21._12_2_ = local_48.slice[6];
      auVar21._14_2_ = local_48.slice[7];
      auVar21._0_2_ = local_48.slice[0];
      auVar21._2_2_ = local_48.slice[1];
      auVar21._4_2_ = local_48.slice[2];
      auVar21._6_2_ = local_48.slice[3];
      auVar18._10_2_ = 0;
      auVar18._0_10_ = auVar21._0_10_;
      auVar18._12_2_ = local_48.slice[3];
      auVar19._8_2_ = local_48.slice[2];
      auVar19._0_2_ = local_48.slice[0];
      auVar19._2_2_ = local_48.slice[1];
      auVar19._4_2_ = local_48.slice[2];
      auVar19._6_2_ = local_48.slice[3];
      auVar19._10_4_ = auVar18._10_4_;
      auVar22._6_8_ = 0;
      auVar22._0_6_ = auVar19._8_6_;
      auVar20._4_2_ = local_48.slice[1];
      auVar20._0_4_ = local_48.slice._0_4_;
      auVar20._6_8_ = SUB148(auVar22 << 0x40,6);
      uVar53 = (ulong)(uint)(iVar31 + iVar30);
      auVar37._0_4_ = (local_48.slice._0_4_ & 0xffff) >> uVar53;
      auVar37._4_4_ = auVar20._4_4_ >> uVar53;
      auVar37._8_4_ = auVar19._8_4_ >> uVar53;
      auVar37._12_2_ = local_48.slice[3] >> uVar53;
      auVar37._14_2_ = 0;
      auVar51._2_2_ = 0;
      auVar51._0_2_ = local_48.slice[4] >> uVar53;
      auVar51._4_2_ = local_48.slice[5] >> uVar53;
      auVar51._6_2_ = 0;
      auVar51._8_2_ = local_48.slice[6] >> uVar53;
      auVar51._10_2_ = 0;
      auVar51._12_2_ = local_48.slice[7] >> uVar53;
      auVar51._14_2_ = 0;
      auVar51 = auVar51 & auVar26;
      auVar37 = auVar37 & auVar26;
      sVar9 = auVar37._0_2_;
      cVar1 = (0 < sVar9) * (sVar9 < 0x100) * auVar37[0] - (0xff < sVar9);
      sVar9 = auVar37._2_2_;
      sVar34 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * auVar37[2] - (0xff < sVar9),cVar1);
      sVar9 = auVar37._4_2_;
      cVar2 = (0 < sVar9) * (sVar9 < 0x100) * auVar37[4] - (0xff < sVar9);
      sVar9 = auVar37._6_2_;
      uVar50 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar37[6] - (0xff < sVar9),
                        CONCAT12(cVar2,sVar34));
      sVar9 = auVar37._8_2_;
      cVar3 = (0 < sVar9) * (sVar9 < 0x100) * auVar37[8] - (0xff < sVar9);
      sVar9 = auVar37._10_2_;
      uVar35 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar37[10] - (0xff < sVar9),
                        CONCAT14(cVar3,uVar50));
      sVar9 = auVar37._12_2_;
      cVar4 = (0 < sVar9) * (sVar9 < 0x100) * auVar37[0xc] - (0xff < sVar9);
      sVar9 = auVar37._14_2_;
      auVar36._0_8_ =
           CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar37[0xe] - (0xff < sVar9),
                    CONCAT16(cVar4,uVar35));
      sVar9 = auVar51._0_2_;
      bVar5 = (0 < sVar9) * (sVar9 < 0x100) * auVar51[0] - (0xff < sVar9);
      auVar36[8] = bVar5;
      auVar36[9] = 0;
      sVar9 = auVar51._4_2_;
      bVar6 = (0 < sVar9) * (sVar9 < 0x100) * auVar51[4] - (0xff < sVar9);
      auVar36[10] = bVar6;
      auVar36[0xb] = 0;
      sVar9 = auVar51._8_2_;
      cVar7 = (0 < sVar9) * (sVar9 < 0x100) * auVar51[8] - (0xff < sVar9);
      auVar36[0xc] = cVar7;
      sVar9 = auVar51._10_2_;
      auVar36[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar51[10] - (0xff < sVar9);
      sVar9 = auVar51._12_2_;
      cVar8 = (0 < sVar9) * (sVar9 < 0x100) * auVar51[0xc] - (0xff < sVar9);
      auVar38[0xe] = cVar8;
      auVar38._0_14_ = auVar36;
      sVar9 = auVar51._14_2_;
      auVar38[0xf] = (0 < sVar9) * (sVar9 < 0x100) * auVar51[0xe] - (0xff < sVar9);
      sVar9 = (short)((uint)uVar50 >> 0x10);
      auVar39[1] = (0 < sVar9) * (sVar9 < 0x100) * cVar2 - (0xff < sVar9);
      auVar39[0] = (0 < sVar34) * (sVar34 < 0x100) * cVar1 - (0xff < sVar34);
      sVar10 = (short)((uint6)uVar35 >> 0x20);
      auVar39[2] = (0 < sVar10) * (sVar10 < 0x100) * cVar3 - (0xff < sVar10);
      sVar11 = (short)((ulong)auVar36._0_8_ >> 0x30);
      auVar39[3] = (0 < sVar11) * (sVar11 < 0x100) * cVar4 - (0xff < sVar11);
      uVar12 = (ushort)bVar5;
      auVar39[4] = (bVar5 != 0) * (uVar12 < 0x100) * bVar5 - (0xff < uVar12);
      uVar13 = (ushort)bVar6;
      auVar39[5] = (bVar6 != 0) * (uVar13 < 0x100) * bVar6 - (0xff < uVar13);
      sVar14 = auVar36._12_2_;
      auVar39[6] = (0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14);
      sVar16 = auVar38._14_2_;
      auVar39[7] = (0 < sVar16) * (sVar16 < 0x100) * cVar8 - (0xff < sVar16);
      auVar39[8] = (0 < sVar34) * (sVar34 < 0x100) * cVar1 - (0xff < sVar34);
      auVar39[9] = (0 < sVar9) * (sVar9 < 0x100) * cVar2 - (0xff < sVar9);
      auVar39[10] = (0 < sVar10) * (sVar10 < 0x100) * cVar3 - (0xff < sVar10);
      auVar39[0xb] = (0 < sVar11) * (sVar11 < 0x100) * cVar4 - (0xff < sVar11);
      auVar39[0xc] = (bVar5 != 0) * (uVar12 < 0x100) * bVar5 - (0xff < uVar12);
      auVar39[0xd] = (bVar6 != 0) * (uVar13 < 0x100) * bVar6 - (0xff < uVar13);
      auVar39[0xe] = (0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14);
      auVar39[0xf] = (0 < sVar16) * (sVar16 < 0x100) * cVar8 - (0xff < sVar16);
      auVar39 = auVar39 & auVar27;
      auVar46._0_14_ = auVar39._0_14_;
      auVar46[0xe] = auVar39[7];
      auVar46[0xf] = auVar39[7];
      auVar45._14_2_ = auVar46._14_2_;
      auVar45._0_13_ = auVar39._0_13_;
      auVar45[0xd] = auVar39[6];
      auVar44._13_3_ = auVar45._13_3_;
      auVar44._0_12_ = auVar39._0_12_;
      auVar44[0xc] = auVar39[6];
      auVar43._12_4_ = auVar44._12_4_;
      auVar43._0_11_ = auVar39._0_11_;
      auVar43[0xb] = auVar39[5];
      auVar42._11_5_ = auVar43._11_5_;
      auVar42._0_10_ = auVar39._0_10_;
      auVar42[10] = auVar39[5];
      auVar41._10_6_ = auVar42._10_6_;
      auVar41._0_9_ = auVar39._0_9_;
      auVar41[9] = auVar39[4];
      auVar40._9_7_ = auVar41._9_7_;
      auVar40._0_8_ = auVar39._0_8_;
      auVar40[8] = auVar39[4];
      Var25 = CONCAT91(CONCAT81(auVar40._8_8_,auVar39[3]),auVar39[3]);
      auVar24._2_10_ = Var25;
      auVar24[1] = auVar39[2];
      auVar24[0] = auVar39[2];
      auVar23._2_12_ = auVar24;
      auVar23[1] = auVar39[1];
      auVar23[0] = auVar39[1];
      auVar47._0_2_ = CONCAT11(auVar39[0],auVar39[0]) * auVar28._0_2_;
      auVar47._2_2_ = auVar23._0_2_ * auVar28._2_2_;
      auVar47._4_2_ = auVar24._0_2_ * auVar28._4_2_;
      auVar47._6_2_ = (short)Var25 * auVar28._6_2_;
      auVar47._8_2_ = auVar40._8_2_ * auVar28._8_2_;
      auVar47._10_2_ = auVar42._10_2_ * auVar28._10_2_;
      auVar47._12_2_ = auVar44._12_2_ * auVar28._12_2_;
      auVar47._14_2_ = auVar45._14_2_ * auVar28._14_2_;
      auVar47 = auVar47 & auVar29;
      sVar9 = auVar47._0_2_;
      sVar10 = auVar47._2_2_;
      sVar11 = auVar47._4_2_;
      sVar14 = auVar47._6_2_;
      sVar16 = auVar47._8_2_;
      sVar34 = auVar47._10_2_;
      sVar15 = auVar47._12_2_;
      sVar17 = auVar47._14_2_;
      auVar48._0_8_ =
           CONCAT17((0 < sVar17) * (sVar17 < 0x100) * auVar47[0xe] - (0xff < sVar17),
                    CONCAT16((0 < sVar15) * (sVar15 < 0x100) * auVar47[0xc] - (0xff < sVar15),
                             CONCAT15((0 < sVar34) * (sVar34 < 0x100) * auVar47[10] -
                                      (0xff < sVar34),
                                      CONCAT14((0 < sVar16) * (sVar16 < 0x100) * auVar47[8] -
                                               (0xff < sVar16),
                                               CONCAT13((0 < sVar14) * (sVar14 < 0x100) * auVar47[6]
                                                        - (0xff < sVar14),
                                                        CONCAT12((0 < sVar11) * (sVar11 < 0x100) *
                                                                 auVar47[4] - (0xff < sVar11),
                                                                 CONCAT11((0 < sVar10) *
                                                                          (sVar10 < 0x100) *
                                                                          auVar47[2] -
                                                                          (0xff < sVar10),
                                                                          (0 < sVar9) *
                                                                          (sVar9 < 0x100) *
                                                                          auVar47[0] -
                                                                          (0xff < sVar9))))))));
      auVar48._8_8_ = 0;
      uVar50 = (undefined4)(auVar48._0_8_ >> 0x20);
      auVar52._4_4_ = uVar50;
      auVar52._0_4_ = uVar50;
      auVar52._8_4_ = uVar50;
      auVar52._12_4_ = uVar50;
      auVar52 = auVar52 | auVar48;
      auVar49._0_4_ = auVar52._0_4_ >> 0x10;
      auVar49._4_4_ = 0;
      auVar49._8_4_ = auVar52._8_4_ >> 0x10;
      auVar49._12_4_ = auVar52._12_4_ >> 0x10;
      *(byte *)key->rd_key = SUB161(auVar49 | auVar52,1) | SUB161(auVar49 | auVar52,0);
      key = (AES_KEY *)((long)key->rd_key + 1);
      iVar30 = iVar30 + 4;
    } while (iVar30 != 0x10);
    iVar31 = iVar31 + 1;
  } while (iVar31 != 4);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void AES_encrypt(const AES_state* rounds, int nrounds, unsigned char* cipher16, const unsigned char* plain16) {
    AES_state s = {{0}};
    int round;

    LoadBytes(&s, plain16);
    AddRoundKey(&s, rounds++);

    for (round = 1; round < nrounds; round++) {
        SubBytes(&s, 0);
        ShiftRows(&s);
        MixColumns(&s, 0);
        AddRoundKey(&s, rounds++);
    }

    SubBytes(&s, 0);
    ShiftRows(&s);
    AddRoundKey(&s, rounds);

    SaveBytes(cipher16, &s);
}